

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurrentThread.cpp
# Opt level: O1

THREAD_ID_TYPE * brynet::net::CurrentThread::tid(void)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = (int *)__tls_get_addr(&PTR_00148d50);
  if (*piVar1 == 0) {
    lVar2 = syscall(0xba);
    *piVar1 = (int)lVar2;
  }
  return piVar1;
}

Assistant:

brynet::net::CurrentThread::THREAD_ID_TYPE& brynet::net::CurrentThread::tid()
{
    if (cachedTid == 0)
    {
#ifdef PLATFORM_WINDOWS
        cachedTid = GetCurrentThreadId();
#else
        cachedTid = static_cast<pid_t>(::syscall(SYS_gettid));
#endif
    }

    return cachedTid;
}